

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreMaterial.cpp
# Opt level: O0

bool __thiscall
Assimp::Ogre::OgreImporter::ReadTextureUnit
          (OgreImporter *this,string *textureUnitName,stringstream *ss,aiMaterial *material)

{
  bool bVar1;
  __type _Var2;
  Logger *pLVar3;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar4;
  basic_formatter *pbVar5;
  long lVar6;
  ulong uVar7;
  mapped_type *pmVar8;
  undefined1 local_c74 [8];
  aiString assimpTextureRef;
  string local_6f8;
  mapped_type local_6d4;
  undefined1 local_6d0 [4];
  uint textureTypeIndex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  string local_690;
  undefined1 local_670 [8];
  string unitNameLower;
  string local_4d8;
  string local_4b8;
  undefined1 local_498 [8];
  string identifier;
  size_t posUnderscore;
  size_t posSuffix;
  int local_444;
  undefined1 local_440 [4];
  int uvCoord;
  string textureRef;
  aiTextureType textureType;
  string partColorOp;
  undefined1 local_3f0 [8];
  string partTextCoordSet;
  undefined1 local_3c8 [8];
  string partTexture;
  string local_230;
  undefined4 local_20c;
  fpos<__mbstate_t> local_208;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_80;
  undefined1 local_50 [8];
  string linePart;
  aiMaterial *material_local;
  stringstream *ss_local;
  string *textureUnitName_local;
  OgreImporter *this_local;
  
  linePart.field_2._8_8_ = material;
  std::__cxx11::string::string((string *)local_50);
  std::operator>>((istream *)ss,(string *)local_50);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)partBlockStart_abi_cxx11_);
  if (bVar1) {
    pLVar3 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[63]>
              (&local_1f8,
               (char (*) [63])"Invalid material: Texture unit block start missing near index ");
    local_208 = (fpos<__mbstate_t>)std::istream::tellg();
    pbVar5 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_1f8,&local_208);
    Formatter::basic_formatter::operator_cast_to_string(&local_80,pbVar5);
    Logger::error(pLVar3,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_1f8);
    this_local._7_1_ = false;
    local_20c = 1;
  }
  else {
    pLVar3 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[18]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&partTexture.field_2 + 8),(char (*) [18])"   texture_unit \'");
    pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        (partTexture.field_2._M_local_buf + 8),textureUnitName);
    pbVar5 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar4,(char (*) [2])0xb4d897);
    Formatter::basic_formatter::operator_cast_to_string(&local_230,pbVar5);
    Logger::debug(pLVar3,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&partTexture.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3c8,"texture",
               (allocator<char> *)(partTextCoordSet.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator
              ((allocator<char> *)(partTextCoordSet.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3f0,"tex_coord_set",
               (allocator<char> *)(partColorOp.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(partColorOp.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&textureType,"colour_op",
               (allocator<char> *)(textureRef.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(textureRef.field_2._M_local_buf + 0xf));
    textureRef.field_2._8_4_ = 0;
    std::__cxx11::string::string((string *)local_440);
    local_444 = 0;
    while (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_50,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)partBlockEnd_abi_cxx11_), bVar1) {
      std::operator>>((istream *)ss,(string *)local_50);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)partComment_abi_cxx11_);
      if (_Var2) {
        SkipLine((string *)&posSuffix,ss);
        std::__cxx11::string::~string((string *)&posSuffix);
      }
      else {
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_50,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_3c8);
        if (_Var2) {
          std::operator>>((istream *)ss,(string *)local_50);
          std::__cxx11::string::operator=((string *)local_440,(string *)local_50);
          if ((this->m_detectTextureTypeFromFilename & 1U) == 0) {
            std::__cxx11::string::string((string *)&local_690,(string *)textureUnitName);
            ToLower((string *)local_670,&local_690);
            std::__cxx11::string::~string((string *)&local_690);
            lVar6 = std::__cxx11::string::find(local_670,0xb757e1);
            if (lVar6 == -1) {
              lVar6 = std::__cxx11::string::find(local_670,0xb75998);
              if (lVar6 == -1) {
                lVar6 = std::__cxx11::string::find(local_670,0xb759a8);
                if (lVar6 == -1) {
                  lVar6 = std::__cxx11::string::find(local_670,0xb759cf);
                  if (lVar6 == -1) {
                    textureRef.field_2._8_4_ = 1;
                  }
                  else {
                    textureRef.field_2._8_4_ = 9;
                  }
                }
                else {
                  textureRef.field_2._8_4_ = 10;
                }
              }
              else {
                textureRef.field_2._8_4_ = 2;
              }
            }
            else {
              textureRef.field_2._8_4_ = 6;
            }
            std::__cxx11::string::~string((string *)local_670);
          }
          else {
            uVar7 = std::__cxx11::string::find_last_of(local_440,0xb6a312);
            identifier.field_2._8_8_ = std::__cxx11::string::find_last_of(local_440,0xb631be);
            if (((uVar7 == 0xffffffffffffffff) || (identifier.field_2._8_8_ == 0xffffffffffffffff))
               || (uVar7 <= (ulong)identifier.field_2._8_8_)) {
              textureRef.field_2._8_4_ = 1;
            }
            else {
              std::__cxx11::string::substr((ulong)&local_4b8,(ulong)local_440);
              ToLower((string *)local_498,&local_4b8);
              std::__cxx11::string::~string((string *)&local_4b8);
              pLVar3 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[47]>
                        ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&unitNameLower.field_2 + 8),
                         (char (*) [47])"Detecting texture type from filename postfix \'");
              pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                       ::operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                    *)(unitNameLower.field_2._M_local_buf + 8),
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_498);
              pbVar5 = (basic_formatter *)
                       Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                       ::operator_(pbVar4,(char (*) [2])0xb4d897);
              Formatter::basic_formatter::operator_cast_to_string(&local_4d8,pbVar5);
              Logger::debug(pLVar3,&local_4d8);
              std::__cxx11::string::~string((string *)&local_4d8);
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                *)((long)&unitNameLower.field_2 + 8));
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_498,"_n");
              if ((((bVar1) ||
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_498,"_nrm"), bVar1)) ||
                  ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_498,"_nrml"), bVar1 ||
                   ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_498,"_normal"), bVar1 ||
                    (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_498,"_normals"), bVar1)))))) ||
                 (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_498,"_normalmap"), bVar1)) {
                textureRef.field_2._8_4_ = 6;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_498,"_s");
                if ((((bVar1) ||
                     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_498,"_spec"), bVar1)) ||
                    (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_498,"_specular"), bVar1)) ||
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_498,"_specularmap"), bVar1)) {
                  textureRef.field_2._8_4_ = 2;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_498,"_l");
                  if (((bVar1) ||
                      (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_498,"_light"), bVar1)) ||
                     ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_498,"_lightmap"), bVar1 ||
                      ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_498,"_occ"), bVar1 ||
                       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_498,"_occlusion"), bVar1)))))) {
                    textureRef.field_2._8_4_ = 10;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_498,"_disp");
                    if ((bVar1) ||
                       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_498,"_displacement"), bVar1)) {
                      textureRef.field_2._8_4_ = 9;
                    }
                    else {
                      textureRef.field_2._8_4_ = 1;
                    }
                  }
                }
              }
              std::__cxx11::string::~string((string *)local_498);
            }
          }
        }
        else {
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_50,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_3f0);
          if (_Var2) {
            std::istream::operator>>(ss,&local_444);
          }
          else {
            std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&textureType);
          }
        }
      }
    }
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      if (textureRef.field_2._8_4_ == 0) {
        pLVar3 = DefaultLogger::get();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_6d0,"Failed to detect texture type for \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_440);
        std::operator+(&local_6b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_6d0,"\', ignoring texture_unit.");
        Logger::warn(pLVar3,&local_6b0);
        std::__cxx11::string::~string((string *)&local_6b0);
        std::__cxx11::string::~string((string *)local_6d0);
        this_local._7_1_ = false;
      }
      else {
        pmVar8 = std::
                 map<aiTextureType,_unsigned_int,_std::less<aiTextureType>,_std::allocator<std::pair<const_aiTextureType,_unsigned_int>_>_>
                 ::operator[](&this->m_textures,(key_type *)(textureRef.field_2._M_local_buf + 8));
        local_6d4 = *pmVar8;
        pmVar8 = std::
                 map<aiTextureType,_unsigned_int,_std::less<aiTextureType>,_std::allocator<std::pair<const_aiTextureType,_unsigned_int>_>_>
                 ::operator[](&this->m_textures,(key_type *)(textureRef.field_2._M_local_buf + 8));
        *pmVar8 = *pmVar8 + 1;
        pLVar3 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[14]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (assimpTextureRef.data + 0x3f8),(char (*) [14])"    texture \'");
        pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                           (assimpTextureRef.data + 0x3f8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_440);
        pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar4,(char (*) [8])"\' type ");
        pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar4,(aiTextureType *)(textureRef.field_2._M_local_buf + 8));
        pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar4,(char (*) [8])0xb74d39);
        pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar4,&local_6d4);
        pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar4,(char (*) [5])" UV ");
        pbVar5 = (basic_formatter *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar4,&local_444);
        Formatter::basic_formatter::operator_cast_to_string(&local_6f8,pbVar5);
        Logger::debug(pLVar3,&local_6f8);
        std::__cxx11::string::~string((string *)&local_6f8);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (assimpTextureRef.data + 0x3f8));
        aiString::aiString((aiString *)local_c74,(string *)local_440);
        aiMaterial::AddProperty
                  ((aiMaterial *)linePart.field_2._8_8_,(aiString *)local_c74,"$tex.file",
                   textureRef.field_2._8_4_,local_6d4);
        aiMaterial::AddProperty
                  ((aiMaterial *)linePart.field_2._8_8_,&local_444,1,"$tex.uvwsrc",
                   textureRef.field_2._8_4_,local_6d4);
        this_local._7_1_ = true;
      }
    }
    else {
      pLVar3 = DefaultLogger::get();
      Logger::warn(pLVar3,"Texture reference is empty, ignoring texture_unit.");
      this_local._7_1_ = false;
    }
    local_20c = 1;
    std::__cxx11::string::~string((string *)local_440);
    std::__cxx11::string::~string((string *)&textureType);
    std::__cxx11::string::~string((string *)local_3f0);
    std::__cxx11::string::~string((string *)local_3c8);
  }
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool OgreImporter::ReadTextureUnit(const std::string &textureUnitName, stringstream &ss, aiMaterial *material)
{
    string linePart;
    ss >> linePart;

    if (linePart != partBlockStart)
    {
        ASSIMP_LOG_ERROR_F( "Invalid material: Texture unit block start missing near index ", ss.tellg());
        return false;
    }

    ASSIMP_LOG_DEBUG_F("   texture_unit '", textureUnitName, "'");

    const string partTexture      = "texture";
    const string partTextCoordSet = "tex_coord_set";
    const string partColorOp      = "colour_op";

    aiTextureType textureType = aiTextureType_NONE;
    std::string textureRef;
    int uvCoord = 0;

    while(linePart != partBlockEnd)
    {
        ss >> linePart;

        // Skip commented lines
        if (linePart == partComment)
        {
            SkipLine(ss);
            continue;
        }

        if (linePart == partTexture)
        {
            ss >> linePart;
            textureRef = linePart;

            // User defined Assimp config property to detect texture type from filename.
            if (m_detectTextureTypeFromFilename)
            {
                size_t posSuffix = textureRef.find_last_of(".");
                size_t posUnderscore = textureRef.find_last_of("_");

                if (posSuffix != string::npos && posUnderscore != string::npos && posSuffix > posUnderscore)
                {
                    string identifier = Ogre::ToLower(textureRef.substr(posUnderscore, posSuffix - posUnderscore));
                    ASSIMP_LOG_DEBUG_F( "Detecting texture type from filename postfix '", identifier, "'");

                    if (identifier == "_n" || identifier == "_nrm" || identifier == "_nrml" || identifier == "_normal" || identifier == "_normals" || identifier == "_normalmap")
                    {
                        textureType = aiTextureType_NORMALS;
                    }
                    else if (identifier == "_s" || identifier == "_spec" || identifier == "_specular" || identifier == "_specularmap")
                    {
                        textureType = aiTextureType_SPECULAR;
                    }
                    else if (identifier == "_l" || identifier == "_light" || identifier == "_lightmap" || identifier == "_occ" || identifier == "_occlusion")
                    {
                        textureType = aiTextureType_LIGHTMAP;
                    }
                    else if (identifier == "_disp" || identifier == "_displacement")
                    {
                        textureType = aiTextureType_DISPLACEMENT;
                    }
                    else
                    {
                        textureType = aiTextureType_DIFFUSE;
                    }
                }
                else
                {
                    textureType = aiTextureType_DIFFUSE;
                }
            }
            // Detect from texture unit name. This cannot be too broad as
            // authors might give names like "LightSaber" or "NormalNinja".
            else
            {
                string unitNameLower = Ogre::ToLower(textureUnitName);
                if (unitNameLower.find("normalmap") != string::npos)
                {
                    textureType = aiTextureType_NORMALS;
                }
                else if (unitNameLower.find("specularmap") != string::npos)
                {
                    textureType = aiTextureType_SPECULAR;
                }
                else if (unitNameLower.find("lightmap") != string::npos)
                {
                    textureType = aiTextureType_LIGHTMAP;
                }
                else if (unitNameLower.find("displacementmap") != string::npos)
                {
                    textureType = aiTextureType_DISPLACEMENT;
                }
                else
                {
                    textureType = aiTextureType_DIFFUSE;
                }
            }
        }
        else if (linePart == partTextCoordSet)
        {
            ss >> uvCoord;
        }
        /// @todo Implement
        else if(linePart == partColorOp)
        {
            /*
            ss >> linePart;
            if("replace"==linePart)//I don't think, assimp has something for this...
            {
            }
            else if("modulate"==linePart)
            {
                //TODO: set value
                //material->AddProperty(aiTextureOp_Multiply)
            }
            */
        }
    }

    if (textureRef.empty())
    {
        ASSIMP_LOG_WARN("Texture reference is empty, ignoring texture_unit.");
        return false;
    }
    if (textureType == aiTextureType_NONE)
    {
        ASSIMP_LOG_WARN("Failed to detect texture type for '" + textureRef  + "', ignoring texture_unit.");
        return false;
    }

    unsigned int textureTypeIndex = m_textures[textureType];
    m_textures[textureType]++;

    ASSIMP_LOG_DEBUG_F( "    texture '", textureRef, "' type ", textureType,
        " index ", textureTypeIndex, " UV ", uvCoord);

    aiString assimpTextureRef(textureRef);
    material->AddProperty(&assimpTextureRef, AI_MATKEY_TEXTURE(textureType, textureTypeIndex));
    material->AddProperty(&uvCoord, 1, AI_MATKEY_UVWSRC(textureType, textureTypeIndex));

    return true;
}